

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O0

bool __thiscall
Corrade::Utility::ConfigurationGroup::setValueInternal
          (ConfigurationGroup *this,string *key,string *value,uint index,
          ConfigurationValueFlags param_4)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  long lVar4;
  ostream *poVar5;
  uint uVar6;
  EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U> local_10c;
  value_type local_108;
  EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U> local_c4;
  reference local_c0;
  Value *v;
  iterator __end2;
  iterator __begin2;
  vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
  *__range2;
  uint foundIndex;
  Flags local_59;
  Error local_58;
  uint local_2c;
  string *psStack_28;
  uint index_local;
  string *value_local;
  string *key_local;
  ConfigurationGroup *this_local;
  ConfigurationValueFlags param_4_local;
  
  local_2c = index;
  psStack_28 = value;
  value_local = key;
  key_local = (string *)this;
  this_local._6_1_ = param_4._value;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    poVar5 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_59);
    Error::Error(&local_58,poVar5,local_59);
    Debug::operator<<(&local_58.super_Debug,"Utility::ConfigurationGroup::setValue(): empty key");
    Error::~Error(&local_58);
    abort();
  }
  lVar4 = std::__cxx11::string::find_first_of((char *)value_local,0x1bb4ca);
  if (lVar4 == -1) {
    __range2._0_4_ = 0;
    __end2 = std::
             vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
             ::begin(&this->_values);
    v = (Value *)std::
                 vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                 ::end(&this->_values);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Corrade::Utility::ConfigurationGroup::Value_*,_std::vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>_>
                                  *)&v);
      if (!bVar1) {
        if ((uint)__range2 < local_2c) {
          this_local._7_1_ = false;
        }
        else {
          std::__cxx11::string::string((string *)&local_108,(string *)value_local);
          std::__cxx11::string::string((string *)&local_108.value,(string *)value);
          std::
          vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
          ::push_back(&this->_values,&local_108);
          Value::~Value(&local_108);
          if (this->_configuration != (Configuration *)0x0) {
            Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::EnumSet
                      (&local_10c,Changed);
            Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::
            operator|=(&this->_configuration->_flags,local_10c);
          }
          this_local._7_1_ = true;
        }
        return this_local._7_1_;
      }
      local_c0 = __gnu_cxx::
                 __normal_iterator<Corrade::Utility::ConfigurationGroup::Value_*,_std::vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>_>
                 ::operator*(&__end2);
      _Var2 = std::operator==(&local_c0->key,value_local);
      if ((_Var2) &&
         (uVar6 = (uint)__range2 + 1, bVar1 = (uint)__range2 == local_2c, __range2._0_4_ = uVar6,
         bVar1)) break;
      __gnu_cxx::
      __normal_iterator<Corrade::Utility::ConfigurationGroup::Value_*,_std::vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::operator=((string *)&local_c0->value,(string *)value);
    if (this->_configuration != (Configuration *)0x0) {
      Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::EnumSet
                (&local_c4,Changed);
      Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::operator|=
                (&this->_configuration->_flags,local_c4);
    }
    return true;
  }
  poVar5 = Error::defaultOutput();
  Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
            ((EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> *)((long)&__range2 + 7))
  ;
  Error::Error((Error *)&foundIndex,poVar5,__range2._7_1_);
  Debug::operator<<((Debug *)&foundIndex,
                    "Utility::ConfigurationGroup::setValue(): disallowed character in key");
  Error::~Error((Error *)&foundIndex);
  abort();
}

Assistant:

bool ConfigurationGroup::setValueInternal(const std::string& key, std::string value, const unsigned int index, ConfigurationValueFlags) {
    CORRADE_ASSERT(!key.empty(), "Utility::ConfigurationGroup::setValue(): empty key", false);
    CORRADE_ASSERT(key.find_first_of("\n=") == std::string::npos,
        "Utility::ConfigurationGroup::setValue(): disallowed character in key", false);

    unsigned int foundIndex = 0;
    for(Value& v: _values) {
        if(v.key == key && foundIndex++ == index) {
            v.value = std::move(value);
            if(_configuration) _configuration->_flags |= Configuration::InternalFlag::Changed;
            return true;
        }
    }

    /* Wanted to set value with index much larger than what we have */
    if(index > foundIndex) return false;

    /* No value with that name was found, add new */
    _values.push_back({key, std::move(value)});

    if(_configuration) _configuration->_flags |= Configuration::InternalFlag::Changed;
    return true;
}